

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

bool __thiscall
InstanceIsLessThanComparator::operator()
          (InstanceIsLessThanComparator *this,shared_ptr<Instance> *lhs,shared_ptr<Instance> *rhs)

{
  char cVar1;
  char cVar2;
  int iVar3;
  element_type *peVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  undefined1 *puVar7;
  int iVar8;
  uint uVar9;
  Context *this_00;
  undefined8 *puVar10;
  ulong uVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  string lhs_type;
  string rhs_type;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  float local_88;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  peVar4 = (lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c8[0] = local_b8;
  pcVar5 = (peVar4->_type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar5,pcVar5 + (peVar4->_type)._M_string_length);
  peVar4 = (rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar5 = (peVar4->_type)._M_dataplus._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar5,pcVar5 + (peVar4->_type)._M_string_length);
  this_00 = Context::get_instance();
  local_88 = Context::get_float_comparison_tolerance(this_00);
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 == 0) {
      bVar12 = (*(byte *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance ^ 1) &
               *(byte *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                         _vptr_Instance;
      goto LAB_001414d1;
    }
  }
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 != 0) goto LAB_00141297;
    cVar1 = *(char *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    cVar2 = *(char *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    bVar14 = SBORROW1(cVar1,cVar2);
    bVar13 = (char)(cVar1 - cVar2) < '\0';
LAB_00141473:
    bVar12 = bVar14 != bVar13;
    goto LAB_001414d1;
  }
LAB_00141297:
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 == 0) {
      iVar3 = *(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      iVar8 = *(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      bVar14 = SBORROW4(iVar3,iVar8);
      bVar13 = iVar3 - iVar8 < 0;
      goto LAB_00141473;
    }
  }
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 != 0) goto LAB_001412ef;
    fVar15 = (float)*(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             [1]._vptr_Instance;
LAB_0014148e:
    fVar15 = fVar15 - *(float *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr[1]._vptr_Instance;
    bVar13 = -local_88 == fVar15;
    bVar14 = -local_88 < fVar15;
LAB_001414cd:
    bVar12 = !bVar14 && !bVar13;
    goto LAB_001414d1;
  }
LAB_001412ef:
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 == 0) {
      fVar15 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance;
      goto LAB_0014148e;
    }
  }
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar8 == 0) {
      fVar15 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance -
               (float)*(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1]._vptr_Instance;
      bVar13 = -local_88 == fVar15;
      bVar14 = -local_88 < fVar15;
      goto LAB_001414cd;
    }
  }
  iVar8 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar8 != 0) {
LAB_00141503:
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = "RuntimeError: cannot compare these two types.";
    __cxa_throw(puVar10,&char_const*::typeinfo,0);
  }
  iVar8 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar8 != 0) goto LAB_00141503;
  peVar4 = (lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70 = local_60;
  pp_Var6 = peVar4[1]._vptr_Instance;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pp_Var6,
             (long)&(peVar4[1].super_enable_shared_from_this<Instance>._M_weak_this.
                     super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Instance
             + (long)pp_Var6);
  peVar4 = (rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pp_Var6 = peVar4[1]._vptr_Instance;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pp_Var6,
             (long)&(peVar4[1].super_enable_shared_from_this<Instance>._M_weak_this.
                     super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Instance
             + (long)pp_Var6);
  puVar7 = local_50;
  uVar11 = local_68;
  if (local_48 < local_68) {
    uVar11 = local_48;
  }
  if (uVar11 == 0) {
LAB_001413f1:
    uVar11 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_68 - local_48)) {
      uVar11 = local_68 - local_48;
    }
    if (0x7ffffffe < (long)uVar11) {
      uVar11 = 0;
    }
  }
  else {
    uVar9 = memcmp(local_70,local_50,uVar11);
    uVar11 = (ulong)uVar9;
    if (uVar9 == 0) goto LAB_001413f1;
  }
  if (puVar7 != local_40) {
    operator_delete(puVar7);
  }
  bVar12 = (byte)(uVar11 >> 0x1f) & 1;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
LAB_001414d1:
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  return (bool)bVar12;
}

Assistant:

bool InstanceIsLessThanComparator::operator()(const std::shared_ptr<Instance>& lhs,
                                              const std::shared_ptr<Instance>& rhs) const {
    const std::string lhs_type = lhs->type();
    const std::string rhs_type = rhs->type();
    float eps = Context::get_instance()->get_float_comparison_tolerance();
    if (lhs_type == "Boolean" && rhs_type == "Boolean")
        return static_cast<const BooleanInstance&>(*lhs).value() < static_cast<const BooleanInstance&>(*rhs).value();
    if (lhs_type == "Character" && rhs_type == "Character")
        return static_cast<const CharacterInstance&>(*lhs).value() <
               static_cast<const CharacterInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Integer")
        return static_cast<const IntegerInstance&>(*lhs).value() < static_cast<const IntegerInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Float")
        return float(static_cast<const IntegerInstance&>(*lhs).value()) -
               static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Float")
        return static_cast<const FloatInstance&>(*lhs).value() - static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Integer")
        return static_cast<const FloatInstance&>(*lhs).value() -
               float(static_cast<const IntegerInstance&>(*rhs).value()) < -eps;
    if (lhs_type == "String" && rhs_type == "String")
        return static_cast<const StringInstance&>(*lhs).value() < static_cast<const StringInstance&>(*rhs).value();
    throw EXC_INVALID_COMPARISON;
}